

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O3

void execute_script_redo_proc(Am_Object *execute_command)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object cmd;
  Am_Value_List cmd_list;
  Am_Object local_70;
  Am_Value_List local_68;
  Am_Value local_58;
  Am_Value local_48;
  Am_Object local_38;
  
  pAVar2 = Am_Object::Get(execute_command,Am_COMMANDS_IN_SCRIPT,0);
  Am_Value_List::Am_Value_List(&local_68,pAVar2);
  local_70.data = (Am_Object_Data *)0x0;
  Am_Value_List::Start(&local_68);
  while( true ) {
    bVar1 = Am_Value_List::Last(&local_68);
    if (bVar1) break;
    pAVar2 = Am_Value_List::Get(&local_68);
    Am_Object::operator=(&local_70,pAVar2);
    Am_Value::Am_Value(&local_48,&Am_No_Value);
    Am_Value::Am_Value(&local_58,&Am_No_Value);
    am_perform_on_cmd_and_impls
              (&local_38,(Am_Slot_Key)&local_70,true,(Am_Value *)0x0,&local_48,SUB81(&local_58,0));
    Am_Object::~Am_Object(&local_38);
    Am_Value::~Am_Value(&local_58);
    Am_Value::~Am_Value(&local_48);
    Am_Value_List::Next(&local_68);
  }
  Am_Object::~Am_Object(&local_70);
  Am_Value_List::~Am_Value_List(&local_68);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, execute_script_redo,
                 (Am_Object execute_command))
{
  Am_Value_List cmd_list = execute_command.Get(Am_COMMANDS_IN_SCRIPT);
  Am_Object cmd;
  //go forwards when redoing
  for (cmd_list.Start(); !cmd_list.Last(); cmd_list.Next()) {
    cmd = cmd_list.Get();
    Am_INTER_TRACE_PRINT(Am_INTER_TRACE_SHORT, "Undoing command " << cmd);
    am_perform_on_cmd_and_impls(cmd, Am_REDO_METHOD);
  }
}